

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O2

void __thiscall AixLog::Log::sync(Log *this)

{
  pointer psVar1;
  element_type *peVar2;
  bool bVar3;
  stringstream *psVar4;
  pointer psVar5;
  pthread_mutex_t *__mutex;
  allocator<char> local_59;
  pthread_mutex_t *local_58;
  string local_50 [8];
  long local_48;
  
  __mutex = (pthread_mutex_t *)&this->mutex_;
  std::recursive_mutex::lock((recursive_mutex *)&__mutex->__data);
  get_stream_abi_cxx11_(this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string(local_50);
  if (local_48 != 0) {
    local_58 = __mutex;
    if ((this->conditional_).is_true_ == true) {
      psVar1 = (this->log_sinks_).
               super__Vector_base<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar5 = (this->log_sinks_).
                    super__Vector_base<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar1; psVar5 = psVar5 + 1
          ) {
        bVar3 = Filter::match(&((psVar5->
                                super___shared_ptr<AixLog::Sink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                               )->filter,&this->metadata_);
        if (bVar3) {
          peVar2 = (psVar5->super___shared_ptr<AixLog::Sink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          get_stream_abi_cxx11_(this);
          std::__cxx11::stringbuf::str();
          (*peVar2->_vptr_Sink[2])(peVar2,&this->metadata_,local_50);
          std::__cxx11::string::~string(local_50);
        }
      }
    }
    __mutex = local_58;
    psVar4 = get_stream_abi_cxx11_(this);
    std::__cxx11::string::string<std::allocator<char>>(local_50,"",&local_59);
    std::__cxx11::stringbuf::str((string *)(psVar4 + 0x18));
    std::__cxx11::string::~string(local_50);
    psVar4 = get_stream_abi_cxx11_(this);
    std::ios::clear((int)psVar4 + (int)*(undefined8 *)(*(long *)psVar4 + -0x18));
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

int sync() override {
    std::lock_guard<std::recursive_mutex> lock(mutex_);
    if (!get_stream().str().empty()) {
      if (conditional_.is_true()) {
        for (const auto& sink : log_sinks_) {
          if (sink->filter.match(metadata_))
            sink->log(metadata_, get_stream().str());
        }
      }
      get_stream().str("");
      get_stream().clear();
    }

    return 0;
  }